

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

int raplcap_msr_pd_is_zone_clamped(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  int iVar1;
  raplcap_msr *ctx;
  int *piVar2;
  off_t msr;
  uint uVar3;
  int cl [2];
  uint64_t msrval;
  int local_38 [2];
  uint64_t local_30;
  
  local_38[0] = 1;
  local_38[1] = 1;
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    msr = ZONE_OFFSETS_PL[zone];
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    msr = -1;
  }
  uVar3 = 0xffffffff;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    iVar1 = msr_sys_read(ctx->sys,&local_30,pkg,die,msr);
    if (iVar1 == 0) {
      msr_is_zone_clamped(&ctx->ctx,zone,local_30,local_38,local_38 + 1);
      uVar3 = (uint)(local_38[1] != 0 && local_38[0] != 0);
    }
  }
  return uVar3;
}

Assistant:

int raplcap_msr_pd_is_zone_clamped(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  uint64_t msrval;
  int cl[2] = { 1, 1 };
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_msr_pd_is_zone_clamped: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msr_is_zone_clamped(&state->ctx, zone, msrval, &cl[0], &cl[1]);
  return cl[0] && cl[1];
}